

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequencer.c
# Opt level: O1

int lws_seq_queue_event(lws_seq_t *seq,lws_seq_events_t e,void *data,void *aux)

{
  lws_dll2 *d;
  int iVar1;
  
  iVar1 = 1;
  if ((seq != (lws_seq_t *)0x0) && (seq->going_down == '\0')) {
    d = (lws_dll2 *)lws_zalloc(0x30,"lws_seq_queue_event");
    if (d != (lws_dll2 *)0x0) {
      *(lws_seq_events_t *)&d[1].owner = e;
      d[1].prev = (lws_dll2 *)data;
      d[1].next = (lws_dll2 *)aux;
      if (10 < (seq->seq_event_owner).count) {
        _lws_log(1,"%s: more than %d events queued\n","lws_seq_queue_event",10);
      }
      lws_dll2_add_tail(d,&seq->seq_event_owner);
      (seq->sul_pending).cb = lws_seq_sul_pending_cb;
      __lws_sul_insert(&seq->pt->pt_sul_owner,&seq->sul_pending,1);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
lws_seq_queue_event(lws_seq_t *seq, lws_seq_events_t e, void *data, void *aux)
{
	lws_seq_event_t *seqe;

	if (!seq || seq->going_down)
		return 1;

	seqe = lws_zalloc(sizeof(*seqe), __func__);
	if (!seqe)
		return 1;

	seqe->e = e;
	seqe->data = data;
	seqe->aux = aux;

	// lwsl_notice("%s: seq %s: event %d\n", __func__, seq->name, e);

	lws_pt_lock(seq->pt, __func__); /* ----------------------------- pt { */

	if (seq->seq_event_owner.count > QUEUE_SANITY_LIMIT) {
		lwsl_err("%s: more than %d events queued\n", __func__,
			 QUEUE_SANITY_LIMIT);
	}

	lws_dll2_add_tail(&seqe->seq_event_list, &seq->seq_event_owner);

	seq->sul_pending.cb = lws_seq_sul_pending_cb;
	__lws_sul_insert(&seq->pt->pt_sul_owner, &seq->sul_pending, 1);

	lws_pt_unlock(seq->pt); /* } pt ------------------------------------- */

	return 0;
}